

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O3

utf8proc_ssize_t
utf8proc_decompose(utf8proc_uint8_t *str,utf8proc_ssize_t strlen,utf8proc_int32_t *buffer,
                  utf8proc_ssize_t bufsize,utf8proc_option_t options)

{
  uint uVar1;
  uint uVar2;
  utf8proc_ssize_t uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  utf8proc_int32_t uc;
  int boundclass;
  int local_4c;
  utf8proc_option_t local_48;
  int local_44;
  utf8proc_ssize_t local_40;
  long local_38;
  
  local_48 = options & (UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE);
  uVar3 = -5;
  if ((options & (UTF8PROC_STRIPMARK|UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) != UTF8PROC_STRIPMARK &&
      local_48 != (UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) {
    local_44 = 0;
    lVar6 = 0;
    lVar4 = 0;
    local_40 = bufsize;
    local_38 = strlen;
    do {
      if ((options & UTF8PROC_NULLTERM) == 0) {
        if (local_38 - lVar6 == 0 || local_38 < lVar6) {
LAB_00134175:
          if (local_48 == 0) {
            return lVar4;
          }
          if (lVar4 <= local_40) {
            if (1 < lVar4) {
              lVar6 = 0;
              do {
                uVar1 = buffer[lVar6];
                uVar2 = buffer[lVar6 + 1];
                lVar5 = lVar6 + 1;
                if ((utf8proc_properties
                     [utf8proc_stage2table
                      [(uVar2 & 0xff) + (uint)utf8proc_stage1table[(int)uVar2 >> 8]]].
                     combining_class <
                     utf8proc_properties
                     [utf8proc_stage2table
                      [(uVar1 & 0xff) + (uint)utf8proc_stage1table[(int)uVar1 >> 8]]].
                     combining_class) &&
                   (0 < utf8proc_properties
                        [utf8proc_stage2table
                         [(uVar2 & 0xff) + (uint)utf8proc_stage1table[(int)uVar2 >> 8]]].
                        combining_class)) {
                  buffer[lVar6] = uVar2;
                  buffer[lVar6 + 1] = uVar1;
                  if (0 < lVar6) {
                    lVar5 = lVar6 + -1;
                  }
                }
                lVar6 = lVar5;
              } while (lVar5 < lVar4 + -1);
              return lVar4;
            }
            return lVar4;
          }
          return lVar4;
        }
        uVar3 = utf8proc_iterate(str + lVar6,local_38 - lVar6,&local_4c);
        if (local_4c < 0) {
          return -3;
        }
        lVar6 = uVar3 + lVar6;
      }
      else {
        uVar3 = utf8proc_iterate(str + lVar6,-1,&local_4c);
        if (local_4c < 0) {
          return -3;
        }
        lVar6 = uVar3 + lVar6;
        if (lVar6 < 0) break;
        if (local_4c == 0) goto LAB_00134175;
      }
      uVar3 = local_40 - lVar4;
      if (uVar3 == 0 || local_40 < lVar4) {
        uVar3 = 0;
      }
      uVar3 = utf8proc_decompose_char(local_4c,buffer + lVar4,uVar3,options,&local_44);
      if (uVar3 < 0) {
        return uVar3;
      }
      lVar4 = lVar4 + uVar3;
    } while (lVar4 < 0x1000000000000000);
    uVar3 = -2;
  }
  return uVar3;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_decompose(
  const utf8proc_uint8_t *str, utf8proc_ssize_t strlen,
  utf8proc_int32_t *buffer, utf8proc_ssize_t bufsize, utf8proc_option_t options
) {
  /* strlen will be ignored, if UTF8PROC_NULLTERM is set in options */
  utf8proc_ssize_t wpos = 0;
  if ((options & UTF8PROC_COMPOSE) && (options & UTF8PROC_DECOMPOSE))
    return UTF8PROC_ERROR_INVALIDOPTS;
  if ((options & UTF8PROC_STRIPMARK) &&
      !(options & UTF8PROC_COMPOSE) && !(options & UTF8PROC_DECOMPOSE))
    return UTF8PROC_ERROR_INVALIDOPTS;
  {
    utf8proc_int32_t uc;
    utf8proc_ssize_t rpos = 0;
    utf8proc_ssize_t decomp_result;
    int boundclass = UTF8PROC_BOUNDCLASS_START;
    while (1) {
      if (options & UTF8PROC_NULLTERM) {
        rpos += utf8proc_iterate(str + rpos, -1, &uc);
        /* checking of return value is not necessary,
           as 'uc' is < 0 in case of error */
        if (uc < 0) return UTF8PROC_ERROR_INVALIDUTF8;
        if (rpos < 0) return UTF8PROC_ERROR_OVERFLOW;
        if (uc == 0) break;
      } else {
        if (rpos >= strlen) break;
        rpos += utf8proc_iterate(str + rpos, strlen - rpos, &uc);
        if (uc < 0) return UTF8PROC_ERROR_INVALIDUTF8;
      }
      decomp_result = utf8proc_decompose_char(
        uc, buffer + wpos, (bufsize > wpos) ? (bufsize - wpos) : 0, options,
        &boundclass
      );
      if (decomp_result < 0) return decomp_result;
      wpos += decomp_result;
      /* prohibiting integer overflows due to too long strings: */
      if (wpos < 0 ||
          wpos > (utf8proc_ssize_t)(SSIZE_MAX/sizeof(utf8proc_int32_t)/2))
        return UTF8PROC_ERROR_OVERFLOW;
    }
  }
  if ((options & (UTF8PROC_COMPOSE|UTF8PROC_DECOMPOSE)) && bufsize >= wpos) {
    utf8proc_ssize_t pos = 0;
    while (pos < wpos-1) {
      utf8proc_int32_t uc1, uc2;
      const utf8proc_property_t *property1, *property2;
      uc1 = buffer[pos];
      uc2 = buffer[pos+1];
      property1 = unsafe_get_property(uc1);
      property2 = unsafe_get_property(uc2);
      if (property1->combining_class > property2->combining_class &&
          property2->combining_class > 0) {
        buffer[pos] = uc2;
        buffer[pos+1] = uc1;
        if (pos > 0) pos--; else pos++;
      } else {
        pos++;
      }
    }
  }
  return wpos;
}